

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uitercollationiterator.cpp
# Opt level: O0

UChar32 __thiscall
icu_63::FCDUIterCollationIterator::previousCodePoint
          (FCDUIterCollationIterator *this,UErrorCode *errorCode)

{
  UBool UVar1;
  uint uVar2;
  int iVar3;
  uint local_28;
  UChar32 prev;
  UChar32 c;
  UErrorCode *errorCode_local;
  FCDUIterCollationIterator *this_local;
  
  while( true ) {
    while (this->state == ITER_CHECK_BWD) {
      uVar2 = (*(code *)((this->super_UIterCollationIterator).iter)->previous)
                        ((this->super_UIterCollationIterator).iter);
      if ((int)uVar2 < 0) {
        this->pos = 0;
        this->start = 0;
        this->state = ITER_IN_FCD_SEGMENT;
        return -1;
      }
      UVar1 = CollationFCD::hasLccc(uVar2);
      if (UVar1 == '\0') {
        return uVar2;
      }
      local_28 = 0xffffffff;
      UVar1 = CollationFCD::maybeTibetanCompositeVowel(uVar2);
      if (UVar1 == '\0') {
        local_28 = (*(code *)((this->super_UIterCollationIterator).iter)->previous)
                             ((this->super_UIterCollationIterator).iter);
        UVar1 = CollationFCD::hasTccc(local_28);
        if (UVar1 == '\0') {
          if ((uVar2 & 0xfffffc00) == 0xdc00) {
            if ((int)local_28 < 0) {
              local_28 = (*(code *)((this->super_UIterCollationIterator).iter)->previous)
                                   ((this->super_UIterCollationIterator).iter);
            }
            if ((local_28 & 0xfffffc00) == 0xd800) {
              return local_28 * 0x400 + uVar2 + -0x35fdc00;
            }
          }
          if ((int)local_28 < 0) {
            return uVar2;
          }
          (*(code *)((this->super_UIterCollationIterator).iter)->next)
                    ((this->super_UIterCollationIterator).iter);
          return uVar2;
        }
      }
      (*(code *)((this->super_UIterCollationIterator).iter)->next)
                ((this->super_UIterCollationIterator).iter);
      if (-1 < (int)local_28) {
        (*(code *)((this->super_UIterCollationIterator).iter)->next)
                  ((this->super_UIterCollationIterator).iter);
      }
      UVar1 = previousSegment(this,errorCode);
      if (UVar1 == '\0') {
        return -1;
      }
    }
    if ((this->state == ITER_IN_FCD_SEGMENT) && (this->pos != this->start)) {
      uVar2 = uiter_previous32_63((this->super_UIterCollationIterator).iter);
      iVar3 = 2;
      if (uVar2 < 0x10000) {
        iVar3 = 1;
      }
      this->pos = this->pos - iVar3;
      return uVar2;
    }
    if ((2 < (int)this->state) && (this->pos != 0)) break;
    switchToBackward(this);
  }
  uVar2 = UnicodeString::char32At(&this->normalized,this->pos + -1);
  iVar3 = 2;
  if (uVar2 < 0x10000) {
    iVar3 = 1;
  }
  this->pos = this->pos - iVar3;
  return uVar2;
}

Assistant:

UChar32
FCDUIterCollationIterator::previousCodePoint(UErrorCode &errorCode) {
    UChar32 c;
    for(;;) {
        if(state == ITER_CHECK_BWD) {
            c = iter.previous(&iter);
            if(c < 0) {
                start = pos = 0;
                state = ITER_IN_FCD_SEGMENT;
                return U_SENTINEL;
            }
            if(CollationFCD::hasLccc(c)) {
                UChar32 prev = U_SENTINEL;
                if(CollationFCD::maybeTibetanCompositeVowel(c) ||
                        CollationFCD::hasTccc(prev = iter.previous(&iter))) {
                    iter.next(&iter);
                    if(prev >= 0) {
                        iter.next(&iter);
                    }
                    if(!previousSegment(errorCode)) {
                        return U_SENTINEL;
                    }
                    continue;
                }
                // hasLccc(trail)=true for all trail surrogates
                if(U16_IS_TRAIL(c)) {
                    if(prev < 0) {
                        prev = iter.previous(&iter);
                    }
                    if(U16_IS_LEAD(prev)) {
                        return U16_GET_SUPPLEMENTARY(prev, c);
                    }
                }
                if(prev >= 0) {
                    iter.next(&iter);
                }
            }
            return c;
        } else if(state == ITER_IN_FCD_SEGMENT && pos != start) {
            c = uiter_previous32(&iter);
            pos -= U16_LENGTH(c);
            U_ASSERT(c >= 0);
            return c;
        } else if(state >= IN_NORM_ITER_AT_LIMIT && pos != 0) {
            c = normalized.char32At(pos - 1);
            pos -= U16_LENGTH(c);
            return c;
        } else {
            switchToBackward();
        }
    }
}